

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

int checkbox_box_width_proc(Am_Object *self)

{
  Am_Value *in_value;
  int local_18;
  Am_Widget_Look local_14;
  int width;
  Am_Widget_Look look;
  Am_Object *self_local;
  
  _width = self;
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_14,in_value);
  if (local_14.value == Am_MOTIF_LOOK_val) {
    local_18 = 0xf;
  }
  else if (local_14.value == Am_WINDOWS_LOOK_val) {
    local_18 = 0xd;
  }
  else {
    if (local_14.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    local_18 = 0xc;
  }
  return local_18;
}

Assistant:

Am_Define_Formula(int, checkbox_box_width)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int width = 0;

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    width = 15;
    break;

  case Am_WINDOWS_LOOK_val:
    width = 13;
    break;

  case Am_MACINTOSH_LOOK_val:
    width = 12;
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  return width;
}